

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O3

void __thiscall
SGParser::TokenizerImpl<SGParser::Generator::RegExprParseToken>::TokenizerImpl
          (TokenizerImpl<SGParser::Generator::RegExprParseToken> *this,InputStream *pinputStream)

{
  (this->super_TokenizerBase).pFreeBuffer = (TokenizerBuffer *)0x0;
  (this->super_TokenizerBase).pInputStream = (InputStream *)0x0;
  (this->super_TokenizerBase).pTail = (char *)0x0;
  (this->super_TokenizerBase).pTailBuffer = (TokenizerBuffer *)0x0;
  (this->super_TokenizerBase).pHead = (char *)0x0;
  (this->super_TokenizerBase).pHeadBuffer = (TokenizerBuffer *)0x0;
  (this->super_TokenStream<SGParser::Generator::RegExprParseToken>)._vptr_TokenStream =
       (_func_int **)&PTR__TokenizerImpl_00163d08;
  TokenizerBase::SetInputStream(&this->super_TokenizerBase,pinputStream);
  return;
}

Assistant:

explicit TokenizerImpl(InputStream* pinputStream) { SetInputStream(pinputStream); }